

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * killer_xname(obj *obj_orig)

{
  byte bVar1;
  char *pcVar2;
  boolean bVar3;
  obj *obj;
  char *str;
  size_t __size;
  
  __size = (ulong)obj_orig->onamelth + (long)obj_orig->oxlth + 0x68;
  obj = (obj *)malloc(__size);
  memcpy(obj,obj_orig,__size);
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffef7f0c | 0x30;
  if (obj->oartifact == '\0') {
    obj->onamelth = '\0';
  }
  bVar1 = objects[obj->otyp].field_0x10;
  objects[obj->otyp].field_0x10 = bVar1 | 1;
  pcVar2 = objects[obj->otyp].oc_uname;
  objects[obj->otyp].oc_uname = (char *)0x0;
  str = xname2(obj,'\0');
  if (obj->quan == 1) {
    bVar3 = obj_is_pname(obj);
    if (bVar3 == '\0') {
      str = an(str);
    }
    else {
      str = the(str);
    }
  }
  objects[obj->otyp].field_0x10 = objects[obj->otyp].field_0x10 & 0xfe | bVar1 & 1;
  objects[obj->otyp].oc_uname = pcVar2;
  free(obj);
  return str;
}

Assistant:

char *killer_xname(const struct obj *obj_orig)
{
    struct obj *obj;
    unsigned save_ocknown;
    char *buf, *save_ocuname;
    int osize;

    /* copy the object. */
    osize = sizeof(struct obj) + obj_orig->onamelth + obj_orig->oxlth;
    obj = malloc(osize);
    memcpy(obj, obj_orig, osize);
    
    /* killer name should be more specific than general xname; however, exact
       info like blessed/cursed and rustproof makes things be too verbose */
    obj->known = obj->dknown = 1;
    obj->bknown = obj->rknown = obj->greased = 0;
    /* if character is a priest[ess], bknown will get toggled back on */
    obj->blessed = obj->cursed = 0;
    /* "killed by poisoned <obj>" would be misleading when poison is
       not the cause of death and "poisoned by poisoned <obj>" would
       be redundant when it is, so suppress "poisoned" prefix */
    obj->opoisoned = 0;
    /* strip user-supplied name; artifacts keep theirs */
    if (!obj->oartifact) obj->onamelth = 0;
    /* temporarily identify the type of object */
    save_ocknown = objects[obj->otyp].oc_name_known;
    objects[obj->otyp].oc_name_known = 1;
    save_ocuname = objects[obj->otyp].oc_uname;
    objects[obj->otyp].oc_uname = 0;	/* avoid "foo called bar" */

    buf = xname(obj);
    if (obj->quan == 1L) buf = obj_is_pname(obj) ? the(buf) : an(buf);

    objects[obj->otyp].oc_name_known = save_ocknown;
    objects[obj->otyp].oc_uname = save_ocuname;
    
    free(obj);
    return buf;
}